

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_client_write(Curl_easy *data,int type,char *ptr,size_t len)

{
  curl_off_t *pcVar1;
  undefined1 *puVar2;
  connectdata *pcVar3;
  void *pvVar4;
  byte bVar5;
  uchar type_00;
  CURLcode CVar6;
  short *psVar7;
  curl_write_callback p_Var8;
  size_t sVar9;
  short *psVar10;
  curl_write_callback p_Var11;
  size_t sVar12;
  char *pcVar13;
  size_t sVar14;
  
  if (((((type & 1U) != 0) && ((data->conn->handler->protocol & 0xc) != 0)) &&
      ((data->conn->proto).ftpc.transfertype == 'A')) && (len != 0 && ptr != (char *)0x0)) {
    bVar5 = (data->state).field_0x51a;
    if ((bVar5 & 1) != 0) {
      if (*ptr == '\n') {
        len = len - 1;
        memmove(ptr,ptr + 1,len);
        pcVar1 = &(data->state).crlf_conversions;
        *pcVar1 = *pcVar1 + 1;
        bVar5 = (data->state).field_0x51a;
      }
      (data->state).field_0x51a = bVar5 & 0xfe;
    }
    psVar7 = (short *)memchr(ptr,0xd,len);
    if (psVar7 != (short *)0x0) {
      for (psVar10 = psVar7; psVar10 < ptr + (len - 1); psVar10 = (short *)((long)psVar10 + 1)) {
        if (*psVar10 == 0xa0d) {
          pcVar13 = (char *)((long)psVar10 + 1);
          psVar10 = (short *)((long)psVar10 + 1);
          *(char *)psVar7 = *pcVar13;
          pcVar1 = &(data->state).crlf_conversions;
          *pcVar1 = *pcVar1 + 1;
        }
        else if ((char)*psVar10 == '\r') {
          *(char *)psVar7 = '\n';
        }
        else {
          *(char *)psVar7 = (char)*psVar10;
        }
        psVar7 = (short *)((long)psVar7 + 1);
      }
      if (psVar10 < ptr + len) {
        if ((char)*psVar10 == '\r') {
          *(char *)psVar7 = '\n';
          puVar2 = &(data->state).field_0x51a;
          *puVar2 = *puVar2 | 1;
        }
        else {
          *(char *)psVar7 = (char)*psVar10;
        }
        psVar7 = (short *)((long)psVar7 + 1);
      }
      if (psVar7 < ptr + len) {
        *(char *)psVar7 = '\0';
      }
      len = (long)psVar7 - (long)ptr;
    }
  }
  if (len == 0) {
    return CURLE_OK;
  }
  pcVar13 = ptr;
  sVar14 = len;
  if (((data->req).keepon & 0x10) != 0) goto LAB_0052f8e8;
  if ((type & 1U) == 0) {
    p_Var11 = (curl_write_callback)0x0;
  }
  else {
    p_Var11 = (data->set).fwrite_func;
  }
  if ((type & 2U) == 0) {
LAB_0052f912:
    p_Var8 = (curl_write_callback)0x0;
  }
  else {
    p_Var8 = (data->set).fwrite_header;
    if (p_Var8 == (curl_write_callback)0x0) {
      if ((data->set).writeheader == (void *)0x0) goto LAB_0052f912;
      p_Var8 = (data->set).fwrite_func;
    }
  }
  pcVar3 = data->conn;
  pvVar4 = (data->set).out;
  do {
    sVar12 = 0x4000;
    if (sVar14 < 0x4000) {
      sVar12 = sVar14;
    }
    if (p_Var11 != (curl_write_callback)0x0) {
      Curl_set_in_callback(data,true);
      sVar9 = (*p_Var11)(pcVar13,1,sVar12,pvVar4);
      Curl_set_in_callback(data,false);
      if (sVar9 == 0x10000001) {
        if ((pcVar3->handler->flags & 0x10) == 0) goto LAB_0052f8e8;
        pcVar13 = "Write callback asked for PAUSE when not supported";
        goto LAB_0052faba;
      }
      if (sVar9 != sVar12) {
        pcVar13 = "Failure writing output to destination";
        goto LAB_0052faba;
      }
    }
    pcVar13 = pcVar13 + sVar12;
    sVar14 = sVar14 - sVar12;
  } while (sVar14 != 0);
  if (((type & 6U) == 2) && ((pcVar3->handler->protocol & 3) != 0)) {
    type_00 = '\x04';
    if (((type & 8U) == 0) && (type_00 = '\b', (type & 0x10U) == 0)) {
      type_00 = '\x02' - ((type & 0x20U) == 0);
    }
    CVar6 = Curl_headers_push(data,ptr,type_00);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
  }
  if (p_Var8 == (curl_write_callback)0x0) {
    return CURLE_OK;
  }
  Curl_set_in_callback(data,true);
  sVar14 = (*p_Var8)(ptr,1,len,(data->set).writeheader);
  Curl_set_in_callback(data,false);
  if (sVar14 != 0x10000001) {
    if (sVar14 == len) {
      return CURLE_OK;
    }
    pcVar13 = "Failed writing header";
LAB_0052faba:
    Curl_failf(data,pcVar13);
    return CURLE_WRITE_ERROR;
  }
  type = type & 0x3cU | 2;
  pcVar13 = ptr;
  sVar14 = len;
LAB_0052f8e8:
  CVar6 = pausewrite(data,type,pcVar13,sVar14);
  return CVar6;
}

Assistant:

CURLcode Curl_client_write(struct Curl_easy *data,
                           int type,
                           char *ptr,
                           size_t len)
{
#if !defined(CURL_DISABLE_FTP) && defined(CURL_DO_LINEEND_CONV)
  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
     (data->conn->handler->protocol & PROTO_FAMILY_FTP) &&
     data->conn->proto.ftpc.transfertype == 'A') {
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
  }
#endif
  return chop_write(data, type, ptr, len);
}